

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hw_identifier.cpp
# Opt level: O2

string * __thiscall
license::hw_identifier::HwIdentifier::print_abi_cxx11_
          (string *__return_storage_ptr__,HwIdentifier *this)

{
  int in_R8D;
  char local_32 [2];
  string result;
  
  base64_abi_cxx11_(&result,(license *)&this->m_data,(void *)0x8,5,in_R8D);
  local_32[1] = 10;
  local_32[0] = '-';
  std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )result._M_dataplus._M_p,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(result._M_dataplus._M_p + result._M_string_length),local_32 + 1,local_32);
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&result);
  std::__cxx11::string::~string((string *)&result);
  return __return_storage_ptr__;
}

Assistant:

std::string HwIdentifier::print() const {
	string result = base64(m_data.data(), m_data.size(), 5);
	std::replace(result.begin(), result.end(), '\n', '-');
	return result.substr(0, result.size() - 1);
}